

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O3

bool s2pred::ArePointsAntipodal(Vector3_xf *x,Vector3_xf *y)

{
  bool bVar1;
  int local_30;
  uint local_2c;
  BIGNUM *local_28;
  
  bVar1 = ArePointsLinearlyDependent(x,y);
  if (bVar1) {
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_30,x);
    BN_free(local_28);
    bVar1 = local_30 < 0 && (local_2c & 0xfffffffd) != 0x7ffffffd;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ArePointsAntipodal(const Vector3_xf& x, const Vector3_xf& y) {
  return ArePointsLinearlyDependent(x, y) && x.DotProd(y).sgn() < 0;
}